

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O0

void installDirs(xmlNodePtr tst,xmlChar *base)

{
  xmlChar *path;
  xmlChar *base_00;
  xmlNodePtr tst_00;
  xmlChar *res;
  xmlChar *name;
  xmlNodePtr test;
  xmlChar *base_local;
  xmlNodePtr tst_local;
  
  path = getString(tst,"string(@name)");
  if (path != (xmlChar *)0x0) {
    base_00 = composeDir(base,path);
    (*_xmlFree)(path);
    if (base_00 != (xmlChar *)0x0) {
      tst_00 = getNext(tst,"./resource[1]");
      if (tst_00 != (xmlNodePtr)0x0) {
        installResources(tst_00,base_00);
      }
      for (name = (xmlChar *)getNext(tst,"./dir[1]"); name != (xmlChar *)0x0;
          name = (xmlChar *)getNext((xmlNodePtr)name,"following-sibling::dir[1]")) {
        installDirs((xmlNodePtr)name,base_00);
      }
      (*_xmlFree)(base_00);
    }
  }
  return;
}

Assistant:

static void
installDirs(xmlNodePtr tst, const xmlChar *base) {
    xmlNodePtr test;
    xmlChar *name, *res;

    name = getString(tst, "string(@name)");
    if (name == NULL)
        return;
    res = composeDir(base, name);
    xmlFree(name);
    if (res == NULL) {
	return;
    }
    /* Now process resources and subdir recursively */
    test = getNext(tst, "./resource[1]");
    if (test != NULL) {
        installResources(test, res);
    }
    test = getNext(tst, "./dir[1]");
    while (test != NULL) {
        installDirs(test, res);
	test = getNext(test, "following-sibling::dir[1]");
    }
    xmlFree(res);
}